

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

void __thiscall QtMWidgets::StepperPrivate::enableButtons(StepperPrivate *this)

{
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  bool needUpdate;
  StepperPrivate *this_local;
  
  if ((this->wrapping & 1U) == 0) {
    if (this->value == this->minimum) {
      local_21 = 1;
      if ((this->minusButtonEnabled & 1U) == 0) {
        local_21 = this->plusButtonEnabled ^ 0xff;
      }
      this->minusButtonEnabled = false;
      this->plusButtonEnabled = true;
      local_24 = local_21;
      if (this->button == Minus) {
        QTimer::stop();
      }
    }
    else if (this->value == this->maximum) {
      local_22 = 1;
      if ((this->minusButtonEnabled & 1U) != 0) {
        local_22 = this->plusButtonEnabled;
      }
      this->minusButtonEnabled = true;
      this->plusButtonEnabled = false;
      local_24 = local_22;
      if (this->button == Plus) {
        QTimer::stop();
      }
    }
    else {
      local_23 = 1;
      if ((this->minusButtonEnabled & 1U) != 0) {
        local_23 = this->plusButtonEnabled ^ 0xff;
      }
      this->minusButtonEnabled = true;
      this->plusButtonEnabled = true;
      local_24 = local_23;
    }
  }
  else {
    local_24 = 1;
    if ((this->minusButtonEnabled & 1U) != 0) {
      local_24 = this->plusButtonEnabled ^ 0xff;
    }
    this->minusButtonEnabled = true;
    this->plusButtonEnabled = true;
  }
  if ((local_24 & 1) != 0) {
    QWidget::update();
  }
  return;
}

Assistant:

void
StepperPrivate::enableButtons()
{
	bool needUpdate = false;

	if( !wrapping )
	{
		if( value == minimum )
		{
			needUpdate = minusButtonEnabled || !plusButtonEnabled;

			minusButtonEnabled = false;
			plusButtonEnabled = true;

			if( button == Minus )
				timer->stop();
		}
		else if( value == maximum )
		{
			needUpdate = !minusButtonEnabled || plusButtonEnabled;

			minusButtonEnabled = true;
			plusButtonEnabled = false;

			if( button == Plus )
				timer->stop();
		}
		else
		{
			needUpdate = !minusButtonEnabled || !plusButtonEnabled;

			minusButtonEnabled = true;
			plusButtonEnabled = true;
		}
	}
	else
	{
		needUpdate = !minusButtonEnabled || !plusButtonEnabled;

		minusButtonEnabled = true;
		plusButtonEnabled = true;
	}

	if( needUpdate )
		q->update();
}